

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

int64_t __thiscall embree::TutorialApplication::getNumRays(TutorialApplication *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  lVar3 = 0;
  lVar2 = 0;
  uVar4 = 0;
  while( true ) {
    iVar1 = tbb::detail::d1::max_concurrency();
    if ((ulong)(long)iVar1 <= uVar4) break;
    lVar2 = lVar2 + *(int *)((long)g_stats->pad + lVar3 + -4);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x80;
  }
  return lVar2;
}

Assistant:

int64_t TutorialApplication::getNumRays()
  {
    int64_t numRays = 0;
    for (size_t i = 0; i < TaskScheduler::threadCount(); i++)
      numRays += g_stats[i].numRays;
    return numRays;
  }